

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_function.hpp
# Opt level: O3

vector __thiscall
sisl::basis_function::grad_convolution_sum_h<3,sisl::body_centered_cubic<char>,sisl::bcc_linear_rdo>
          (basis_function *this,vector *p,body_centered_cubic<char> *base,
          body_centered_cubic<char> **lattices,double *h)

{
  body_centered_cubic<char> *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__function;
  Index extraout_RDX;
  long lVar3;
  DenseStorage<int,__1,__1,_1,_0> *other;
  vector vVar4;
  lattice_site c;
  lattice_site s;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  sites;
  lattice_site extent;
  vector local_e8;
  void *local_d8 [2];
  DenseStorage<int,__1,__1,_1,_0> local_c8;
  double local_b8;
  double *local_b0;
  vector *local_a8;
  DenseStorage<int,__1,__1,_1,_0> *local_a0;
  body_centered_cubic<char> *local_98;
  vector *local_90;
  DenseStorage<int,__1,__1,_1,_0> *local_88;
  vector *local_80;
  DenseStorage<int,__1,__1,_1,_0> *local_78;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  local_58;
  void *local_40 [2];
  
  local_b0 = h;
  bcc_linear_rdo::get_integer_support<3>();
  local_a8 = p;
  (*(base->super_base_lattice<char>)._vptr_base_lattice[0xe])(&local_e8,base,p);
  (*(base->super_base_lattice<char>)._vptr_base_lattice[10])(local_40,base);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,3,3,1);
  lVar3 = *(long *)(this + 8);
  if (lVar3 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_98 = base;
  if (lVar3 != 0) {
    memset(*(void **)this,0,lVar3 << 3);
  }
  local_a0 = (DenseStorage<int,__1,__1,_1,_0> *)
             local_58.
             super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58.
      super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    other = (DenseStorage<int,__1,__1,_1,_0> *)
            local_58.
            super__Vector_base<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage(&local_c8,other);
      local_90 = &local_e8;
      local_88 = &local_c8;
      if (local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != local_c8.m_rows) {
LAB_00150842:
        __function = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<int>, Lhs = const Eigen::Matrix<int, -1, 1>, Rhs = const Eigen::Matrix<int, -1, 1>]"
        ;
LAB_00150857:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
      }
      Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_d8,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                  *)&local_90);
      iVar2 = (*(local_98->super_base_lattice<char>)._vptr_base_lattice[0x11])
                        (local_98,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_d8);
      free(local_d8[0]);
      if ((char)iVar2 != '\0') {
        if (local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != local_c8.m_rows) goto LAB_00150842;
        local_90 = local_a8;
        local_80 = &local_e8;
        local_78 = &local_c8;
        if ((local_a8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows != local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows) {
          __function = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int, double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int, double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int>, const Eigen::Matrix<int, -1, 1>, const Eigen::Matrix<int, -1, 1>>>]"
          ;
          goto LAB_00150857;
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_d8,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>_>
                    *)&local_90);
        local_b8 = bcc_linear_rdo::phi<3>(local_b0,(vector *)local_d8);
        free(local_d8[0]);
        if ((local_b8 != 0.0) || (NAN(local_b8))) {
          lVar3 = 0;
          do {
            pbVar1 = lattices[lVar3];
            if (pbVar1 != (body_centered_cubic<char> *)0x0) {
              local_90 = &local_e8;
              local_88 = &local_c8;
              if (local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows != local_c8.m_rows) goto LAB_00150842;
              Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
              PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                        ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_d8,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                          *)&local_90);
              iVar2 = (*(pbVar1->super_base_lattice<char>)._vptr_base_lattice[0x14])
                                (pbVar1,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_d8)
              ;
              free(local_d8[0]);
              if ((char)iVar2 != '\0') {
                pbVar1 = lattices[lVar3];
                local_90 = &local_e8;
                local_88 = &local_c8;
                if (local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows != local_c8.m_rows) goto LAB_00150842;
                Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
                PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                          ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_d8,
                           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                            *)&local_90);
                iVar2 = (*(pbVar1->super_base_lattice<char>)._vptr_base_lattice[5])
                                  (pbVar1,(PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)
                                          local_d8);
                if (*(long *)(this + 8) <= lVar3) {
                  __assert_fail("index >= 0 && index < size()",
                                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                               );
                }
                *(double *)(*(long *)this + lVar3 * 8) =
                     (double)(int)*(char *)CONCAT44(extraout_var,iVar2) * local_b8 +
                     *(double *)(*(long *)this + lVar3 * 8);
                free(local_d8[0]);
              }
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
        }
      }
      free(local_c8.m_data);
      other = other + 1;
    } while (other != local_a0);
  }
  free(local_40[0]);
  free(local_e8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_58);
  vVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  vVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (vector)vVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

static vector grad_convolution_sum_h(const vector &p, const L* base, const L **lattices, const double &h) {
            auto sites = BF::template get_integer_support<N>();
            lattice_site c = base->get_nearest_site(p);
            lattice_site extent = base->get_dimensions();

            vector value(N);
            value.setZero();

            for(lattice_site s : sites) {
                if(!base->is_lattice_site(c+s)) continue;

                double w = BF::template phi<N>(h, p - (c+s).cast<double>());

                if(w == 0.) continue;

                for(int j = 0; j < N; j++) {
                    if(lattices[j] == nullptr) continue;
                    if(!lattices[j]->is_filled(c+s)) continue;
                    value[j] += w * (double)(*lattices[j])(c + s);
                }
            }
            return value;
        }